

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenModuleRef BinaryenModuleParse(char *text)

{
  Module *this;
  Module *wasm;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_R9;
  string_view in;
  undefined1 local_1f0 [392];
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined1 local_40 [8];
  Result<wasm::Ok> parsed;
  
  this = (Module *)operator_new(0x3f0);
  ::wasm::Module::Module(this);
  wasm = (Module *)strlen(text);
  local_68._M_engaged = false;
  in._M_str = (char *)&local_68;
  in._M_len = (size_t)text;
  ::wasm::WATParser::parseModule((Result<wasm::Ok> *)local_40,(WATParser *)this,wasm,in,in_R9);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_68);
  if (parsed.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ != '\x01') {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_40);
    return this;
  }
  ::wasm::Fatal::Fatal((Fatal *)local_1f0);
  std::operator<<((ostream *)(local_1f0 + 0x10),(string *)local_40);
  ::wasm::Fatal::operator<<((Fatal *)local_1f0,(char (*) [2])0xe564bf);
  ::wasm::Fatal::~Fatal((Fatal *)local_1f0);
}

Assistant:

BinaryenModuleRef BinaryenModuleParse(const char* text) {
  auto* wasm = new Module;
  auto parsed = WATParser::parseModule(*wasm, text);
  if (auto* err = parsed.getErr()) {
    Fatal() << err->msg << "\n";
  }
  return wasm;
}